

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint32 stbi__get32be(stbi__context *s)

{
  int iVar1;
  int iVar2;
  stbi__uint32 z;
  stbi__context *s_local;
  
  iVar1 = stbi__get16be(s);
  iVar2 = stbi__get16be(s);
  return iVar1 * 0x10000 + iVar2;
}

Assistant:

static stbi__uint32 stbi__get32be(stbi__context *s)
{
   stbi__uint32 z = stbi__get16be(s);
   return (z << 16) + stbi__get16be(s);
}